

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O1

ssize_t ws_cw_dec_next(uchar *buf,size_t buflen,int frame_age,int frame_flags,
                      curl_off_t payload_offset,curl_off_t payload_len,void *user_data,CURLcode *err
                      )

{
  Curl_easy *data;
  long lVar1;
  curl_trc_feat *pcVar2;
  CURLcode CVar3;
  long lVar4;
  size_t bytes;
  size_t sStack_28;
  
  data = *user_data;
  if (payload_len == buflen + payload_offset && (frame_flags & 0x10U) != 0) {
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(data,"WS: auto-respond to PING with a PONG");
    }
    CVar3 = curl_ws_send(data,buf,buflen,&sStack_28,0,0x40);
  }
  else {
    lVar4 = payload_len - (buflen + payload_offset);
    if (buflen == 0 && lVar4 != 0) goto LAB_0016a9e8;
    lVar1 = *(long *)((long)user_data + 8);
    *(int *)(lVar1 + 0xe0) = frame_age;
    *(int *)(lVar1 + 0xe4) = frame_flags;
    *(curl_off_t *)(lVar1 + 0xe8) = payload_offset;
    *(size_t *)(lVar1 + 0xf8) = buflen;
    *(long *)(lVar1 + 0xf0) = lVar4;
    CVar3 = Curl_cwriter_write(data,*(Curl_cwriter **)((long)user_data + 0x10),
                               *(int *)((long)user_data + 0x18),(char *)buf,buflen);
  }
  *err = CVar3;
  if (CVar3 != CURLE_OK) {
    return -1;
  }
LAB_0016a9e8:
  *err = CURLE_OK;
  return buflen;
}

Assistant:

static ssize_t ws_cw_dec_next(const unsigned char *buf, size_t buflen,
                              int frame_age, int frame_flags,
                              curl_off_t payload_offset,
                              curl_off_t payload_len,
                              void *user_data,
                              CURLcode *err)
{
  struct ws_cw_dec_ctx *ctx = user_data;
  struct Curl_easy *data = ctx->data;
  struct websocket *ws = ctx->ws;
  curl_off_t remain = (payload_len - (payload_offset + buflen));

  (void)frame_age;
  if((frame_flags & CURLWS_PING) && !remain) {
    /* auto-respond to PINGs, only works for single-frame payloads atm */
    size_t bytes;
    infof(data, "WS: auto-respond to PING with a PONG");
    /* send back the exact same content as a PONG */
    *err = curl_ws_send(data, buf, buflen, &bytes, 0, CURLWS_PONG);
    if(*err)
      return -1;
  }
  else if(buflen || !remain) {
    /* forward the decoded frame to the next client writer. */
    update_meta(ws, frame_age, frame_flags, payload_offset,
                payload_len, buflen);

    *err = Curl_cwriter_write(data, ctx->next_writer, ctx->cw_type,
                              (const char *)buf, buflen);
    if(*err)
      return -1;
  }
  *err = CURLE_OK;
  return (ssize_t)buflen;
}